

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

void apprun_file_copy(char *source_path,char *target_path)

{
  int __c;
  FILE *__stream;
  FILE *__stream_00;
  int ch;
  FILE *target;
  FILE *source;
  char *target_path_local;
  char *source_path_local;
  
  __stream = fopen(source_path,"r");
  __stream_00 = fopen(target_path,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Unable to read file: %s\n",source_path);
    exit(1);
  }
  if (__stream_00 != (FILE *)0x0) {
    while (__c = fgetc(__stream), __c != -1) {
      fputc(__c,__stream_00);
    }
    fclose(__stream);
    fclose(__stream_00);
    return;
  }
  fprintf(_stderr,"Unable to write file: %s\n",target_path);
  exit(1);
}

Assistant:

void apprun_file_copy(const char *source_path, const char *target_path) {
    FILE *source, *target;

    source = fopen(source_path, "r");
    target = fopen(target_path, "w");

    if (source == NULL) {
        fprintf(stderr, "Unable to read file: %s\n", source_path);
        exit(1);
    }

    if (target == NULL) {
        fprintf(stderr, "Unable to write file: %s\n", target_path);
        exit(1);
    }


    int ch;
    while ((ch = fgetc(source)) != EOF)
        fputc(ch, target);

    fclose(source);
    fclose(target);
}